

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

void __thiscall QSslSocketGlobalData::QSslSocketGlobalData(QSslSocketGlobalData *this)

{
  QSslConfigurationPrivate *pQVar1;
  
  (this->supportedEllipticCurves).d.d = (Data *)0x0;
  (this->supportedEllipticCurves).d.ptr = (QSslEllipticCurve *)0x0;
  (this->supportedCiphers).d.ptr = (QSslCipher *)0x0;
  (this->supportedCiphers).d.size = 0;
  (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  (this->supportedCiphers).d.d = (Data *)0x0;
  (this->supportedEllipticCurves).d.size = 0;
  pQVar1 = (QSslConfigurationPrivate *)operator_new(0x140);
  QSslConfigurationPrivate::QSslConfigurationPrivate(pQVar1);
  (this->config).d.ptr = pQVar1;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (QSslConfigurationPrivate *)operator_new(0x140);
  QSslConfigurationPrivate::QSslConfigurationPrivate(pQVar1);
  (this->dtlsConfig).d.ptr = pQVar1;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  ((this->dtlsConfig).d.ptr)->protocol = DtlsV1_2OrLater;
  return;
}

Assistant:

QSslSocketGlobalData()
        : config(new QSslConfigurationPrivate),
          dtlsConfig(new QSslConfigurationPrivate)
    {
#if QT_CONFIG(dtls)
        dtlsConfig->protocol = QSsl::DtlsV1_2OrLater;
#endif // dtls
    }